

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderLp.cpp
# Opt level: O3

void __thiscall
FilereaderLp::writeToFileMatrixRow
          (FilereaderLp *this,FILE *file,HighsInt iRow,HighsSparseMatrix *ar_matrix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *col_names)

{
  int iVar1;
  pointer piVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pcVar6;
  long lVar7;
  long lVar8;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar7 = (long)iRow;
  piVar2 = (ar_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[lVar7];
  lVar8 = (long)iVar1;
  if (iVar1 < piVar2[lVar7 + 1]) {
    pbVar3 = (col_names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (col_names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    do {
      iVar1 = (ar_matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      writeToFile(this,file," %+.15g",
                  (ar_matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8]);
      if (pbVar4 == pbVar3) {
        writeToFile(this,file," x%d",(ulong)(iVar1 + 1));
      }
      else {
        pbVar5 = (col_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar6 = pbVar5[iVar1]._M_dataplus._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar6,pcVar6 + pbVar5[iVar1]._M_string_length);
        writeToFile(this,file," %s",local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (ar_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7 + 1]);
  }
  return;
}

Assistant:

void FilereaderLp::writeToFileMatrixRow(FILE* file, const HighsInt iRow,
                                        const HighsSparseMatrix ar_matrix,
                                        const std::vector<string> col_names) {
  assert(ar_matrix.isRowwise());
  const bool has_col_names = allow_model_names && col_names.size() > 0;

  for (HighsInt iEl = ar_matrix.start_[iRow]; iEl < ar_matrix.start_[iRow + 1];
       iEl++) {
    HighsInt iCol = ar_matrix.index_[iEl];
    double coef = ar_matrix.value_[iEl];
    this->writeToFileValue(file, coef);
    if (has_col_names) {
      this->writeToFileVar(file, col_names[iCol]);
    } else {
      this->writeToFileVar(file, iCol);
    }
  }
}